

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O3

void __thiscall
enact::FieldExpr::FieldExpr
          (FieldExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *object,
          Token *name,Token *oper)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__FieldExpr_00127690;
  (this->object)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (object->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
       super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (object->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->name).type = name->type;
  paVar1 = &(this->name).lexeme.field_2;
  (this->name).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->lexeme)._M_dataplus._M_p;
  paVar2 = &(name->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(name->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->name).lexeme._M_dataplus._M_p = pcVar3;
    (this->name).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name).lexeme._M_string_length = (name->lexeme)._M_string_length;
  (name->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (name->lexeme)._M_string_length = 0;
  (name->lexeme).field_2._M_local_buf[0] = '\0';
  (this->name).col = name->col;
  (this->name).line = name->line;
  (this->oper).type = oper->type;
  paVar1 = &(this->oper).lexeme.field_2;
  (this->oper).lexeme._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (oper->lexeme)._M_dataplus._M_p;
  paVar2 = &(oper->lexeme).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(oper->lexeme).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->oper).lexeme.field_2 + 8) = uVar4;
  }
  else {
    (this->oper).lexeme._M_dataplus._M_p = pcVar3;
    (this->oper).lexeme.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->oper).lexeme._M_string_length = (oper->lexeme)._M_string_length;
  (oper->lexeme)._M_dataplus._M_p = (pointer)paVar2;
  (oper->lexeme)._M_string_length = 0;
  (oper->lexeme).field_2._M_local_buf[0] = '\0';
  (this->oper).col = oper->col;
  (this->oper).line = oper->line;
  return;
}

Assistant:

FieldExpr(std::unique_ptr<Expr> object, Token name, Token oper) :
                object{std::move(object)},
                name{std::move(name)},
                oper{std::move(oper)} {}